

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::consume(Scanner *this,uint32_t Expected)

{
  char *pcVar1;
  
  if (Expected < 0x80) {
    pcVar1 = this->Current;
    if (pcVar1 != this->End) {
      if (*pcVar1 < '\0') goto LAB_0015a2c8;
      if ((int)*pcVar1 == Expected) {
        this->Current = pcVar1 + 1;
        this->Column = this->Column + 1;
        return true;
      }
    }
    return false;
  }
LAB_0015a2c8:
  report_fatal_error("Not dealing with this yet",true);
}

Assistant:

bool Scanner::consume(uint32_t Expected) {
  if (Expected >= 0x80)
    report_fatal_error("Not dealing with this yet");
  if (Current == End)
    return false;
  if (uint8_t(*Current) >= 0x80)
    report_fatal_error("Not dealing with this yet");
  if (uint8_t(*Current) == Expected) {
    ++Current;
    ++Column;
    return true;
  }
  return false;
}